

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O1

bool __thiscall wabt::Opcode::IsNaturallyAligned(Opcode *this,Address alignment)

{
  Address *pAVar1;
  
  pAVar1 = (Address *)(infos_ + 0x9978);
  if ((ulong)this->enum_ < 0x221) {
    pAVar1 = (Address *)(infos_ + (ulong)this->enum_ * 0x48 + 0x30);
  }
  return *pAVar1 == alignment || alignment == 0xffffffffffffffff;
}

Assistant:

Opcode::Info Opcode::GetInfo() const {
  if (enum_ < Invalid) {
    return infos_[enum_];
  }

  Info invalid_info = infos_[Opcode::Invalid];
  DecodeInvalidOpcode(enum_, &invalid_info.prefix, &invalid_info.code);
  invalid_info.prefix_code = PrefixCode(invalid_info.prefix, invalid_info.code);
  return invalid_info;
}